

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O0

cx_string<5UL> mserialize::cx_strcat<5ul>(cx_string<5UL> *strings)

{
  cx_string<5UL> cVar1;
  cx_string<5UL> *in_RDI;
  size_t s;
  size_t i;
  char *out;
  size_t size [2];
  char *data [2];
  char buffer [6];
  ulong local_50;
  ulong local_48;
  char *local_40;
  ulong local_38;
  size_t local_30;
  char *local_28;
  data_ref local_20;
  char local_16 [6];
  cx_string<5UL> *local_10;
  cx_string<5UL> local_6;
  
  local_10 = in_RDI;
  memset(local_16,0,6);
  local_28 = "";
  local_20 = cx_string<5UL>::data(local_10);
  local_38 = 0;
  local_30 = cx_string<5UL>::size(local_10);
  local_40 = local_16;
  for (local_48 = 1; local_48 < 2; local_48 = local_48 + 1) {
    for (local_50 = 0; local_50 < (&local_38)[local_48]; local_50 = local_50 + 1) {
      *local_40 = (&local_28)[local_48][local_50];
      local_40 = local_40 + 1;
    }
  }
  cx_string<5UL>::cx_string(&local_6,local_16);
  cVar1._data[4] = local_6._data[4];
  cVar1._data[5] = local_6._data[5];
  cVar1._data[0] = local_6._data[0];
  cVar1._data[1] = local_6._data[1];
  cVar1._data[2] = local_6._data[2];
  cVar1._data[3] = local_6._data[3];
  return (cx_string<5UL>)cVar1._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}